

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeopyramid.cpp
# Opt level: O2

void pzgeom::TPZGeoPyramid::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  TPZGeoNode *this;
  int j;
  long lVar7;
  long lVar8;
  int i_1;
  int64_t index;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<long,_5> nodeindexes;
  
  TPZManVector<double,_3>::TPZManVector(&co,3);
  TPZManVector<double,_3>::TPZManVector(&shift,3);
  TPZManVector<double,_3>::TPZManVector(&scale,3);
  TPZManVector<long,_5>::TPZManVector(&nodeindexes,5);
  pdVar4 = size->fStore;
  pdVar5 = lowercorner->fStore;
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    scale.super_TPZVec<double>.fStore[lVar8] = pdVar4[lVar8] / 3.0;
    shift.super_TPZVec<double>.fStore[lVar8] = pdVar5[lVar8] + 0.5;
  }
  for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
    pztopology::TPZPyramid::ParametricDomainNodeCoord((int)lVar8,&co.super_TPZVec<double>);
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      dVar1 = scale.super_TPZVec<double>.fStore[lVar7];
      dVar2 = co.super_TPZVec<double>.fStore[lVar7];
      dVar3 = shift.super_TPZVec<double>.fStore[lVar7];
      iVar6 = rand();
      co.super_TPZVec<double>.fStore[lVar7] =
           ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 * dVar2 + dVar3 + -0.1;
    }
    iVar6 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    nodeindexes.super_TPZVec<long>.fStore[lVar8] = (long)iVar6;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar6);
    TPZGeoNode::Initialize(this,&co.super_TPZVec<double>,gmesh);
  }
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])(gmesh,5,&nodeindexes,matid,&index,1);
  TPZManVector<long,_5>::~TPZManVector(&nodeindexes);
  TPZManVector<double,_3>::~TPZManVector(&scale);
  TPZManVector<double,_3>::~TPZManVector(&shift);
  TPZManVector<double,_3>::~TPZManVector(&co);
  return;
}

Assistant:

void
    TPZGeoPyramid::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size) {
        TPZManVector<REAL, 3> co(3), shift(3), scale(3);
        TPZManVector<int64_t, 5> nodeindexes(5);
        for (int i = 0; i < 3; i++) {
            scale[i] = size[i] / 3.;
            shift[i] = 1. / 2. + lowercorner[i];
        }

        for (int i = 0; i < NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            for (int j = 0; j < 3; j++) {
                co[j] = shift[j] + scale[j] * co[j] + (rand() * 0.2 / RAND_MAX) - 0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(EPiramide, nodeindexes, matid, index);
    }